

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysp_node * lysp_node_child(lysp_node *node)

{
  lysp_node **pplVar1;
  lysp_node *plVar2;
  
  if (node != (lysp_node *)0x0) {
    pplVar1 = lysp_node_child_p(node);
    if (pplVar1 == (lysp_node **)0x0) {
      plVar2 = (lysp_node *)0x0;
    }
    else {
      plVar2 = *pplVar1;
    }
    return plVar2;
  }
  return (lysp_node *)0x0;
}

Assistant:

lysp_node *
lysp_node_child(const struct lysp_node *node)
{
    struct lysp_node **child;

    if (!node) {
        return NULL;
    }

    child = lysp_node_child_p((struct lysp_node *)node);
    if (child) {
        return *child;
    } else {
        return NULL;
    }
}